

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall defval_ctx::add(defval_ctx *this,CTcSymLocal *l)

{
  int iVar1;
  CTcSymLocal **__src;
  CTcSymLocal **__dest;
  ulong uVar2;
  
  iVar1 = this->nvalo;
  if (this->nv == iVar1) {
    uVar2 = 0xffffffffffffffff;
    if (-0x81 < iVar1) {
      uVar2 = (long)iVar1 * 8 + 0x400;
    }
    __dest = (CTcSymLocal **)operator_new__(uVar2);
    __src = this->v;
    memcpy(__dest,__src,(long)iVar1 << 3);
    if (__src != (CTcSymLocal **)0x0) {
      operator_delete__(__src);
    }
    this->v = __dest;
    this->nvalo = this->nvalo + 0x80;
  }
  iVar1 = this->nv;
  this->nv = iVar1 + 1;
  this->v[iVar1] = l;
  return;
}

Assistant:

void add(CTcSymLocal *l)
    {
        /* if there's not room, expand the array */
        if (nv == nvalo)
        {
            CTcSymLocal **vnew = new CTcSymLocal*[nvalo + 128];
            memcpy(vnew, v, nvalo * sizeof(*vnew));
            delete [] v;
            v = vnew;
            nvalo += 128;
        }

        /* add it */
        v[nv++] = l;
    }